

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void walIndexClose(Wal *pWal,int isDelete)

{
  int local_18;
  int i;
  int isDelete_local;
  Wal *pWal_local;
  
  if ((pWal->exclusiveMode == '\x02') || (pWal->bShmUnreliable != '\0')) {
    for (local_18 = 0; local_18 < pWal->nWiData; local_18 = local_18 + 1) {
      sqlite3_free(pWal->apWiData[local_18]);
      pWal->apWiData[local_18] = (u32 *)0x0;
    }
  }
  if (pWal->exclusiveMode != '\x02') {
    sqlite3OsShmUnmap(pWal->pDbFd,isDelete);
  }
  return;
}

Assistant:

static void walIndexClose(Wal *pWal, int isDelete){
  if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE || pWal->bShmUnreliable ){
    int i;
    for(i=0; i<pWal->nWiData; i++){
      sqlite3_free((void *)pWal->apWiData[i]);
      pWal->apWiData[i] = 0;
    }
  }
  if( pWal->exclusiveMode!=WAL_HEAPMEMORY_MODE ){
    sqlite3OsShmUnmap(pWal->pDbFd, isDelete);
  }
}